

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptron.hpp
# Opt level: O0

void __thiscall Preceptron::Construct(Preceptron *this,int inputNum)

{
  int iVar1;
  clock_t cVar2;
  reference pvVar3;
  int local_18;
  int i;
  int inputNum_local;
  Preceptron *this_local;
  
  cVar2 = clock();
  srand((uint)cVar2);
  std::vector<double,_std::allocator<double>_>::resize(&this->weight,(long)inputNum);
  std::vector<double,_std::allocator<double>_>::resize(&this->delta_weight,(long)inputNum);
  std::vector<double,_std::allocator<double>_>::resize(&this->delta_bias,(long)inputNum);
  std::vector<double,_std::allocator<double>_>::resize(&this->input,(long)inputNum);
  iVar1 = rand();
  this->bias = (double)(iVar1 % 1000) / 1000.0;
  for (local_18 = 0; local_18 < inputNum; local_18 = local_18 + 1) {
    iVar1 = rand();
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->weight,(long)local_18);
    *pvVar3 = (double)(iVar1 % 1000) / 1000.0;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->delta_weight,(long)local_18);
    *pvVar3 = 0.0;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->delta_bias,(long)local_18);
    *pvVar3 = 0.0;
  }
  this->motivation = 0.2;
  this->learning_step = 1.2;
  this->useBias = false;
  return;
}

Assistant:

virtual void Construct(int inputNum) {
		srand(clock());
		weight.resize(inputNum);
		delta_weight.resize(inputNum);
		delta_bias.resize(inputNum);
		input.resize(inputNum);

		bias = (double)(rand() % 1000) / 1000;
		for (int i = 0; i < inputNum; i++) {
			weight[i] = (double)(rand() % 1000) / 1000;
			delta_weight[i] = 0.0;
			delta_bias[i] = 0.0;
		}

		motivation = 0.2;
		learning_step = 1.2;
		useBias = false;
	}